

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O2

LRUHandle ** __thiscall
leveldb::anon_unknown_0::HandleTable::FindPointer(HandleTable *this,Slice *key,uint32_t hash)

{
  bool bVar1;
  LRUHandle *pLVar2;
  LRUHandle **ppLVar3;
  Slice local_30;
  
  ppLVar3 = this->list_ + (this->length_ - 1 & hash);
  do {
    pLVar2 = *ppLVar3;
    if (pLVar2 == (LRUHandle *)0x0) {
      return ppLVar3;
    }
    if (pLVar2->hash == hash) {
      local_30.size_ = pLVar2->key_length;
      local_30.data_ = pLVar2->key_data;
      bVar1 = operator!=(key,&local_30);
      if (!bVar1) {
        return ppLVar3;
      }
      pLVar2 = *ppLVar3;
    }
    ppLVar3 = &pLVar2->next_hash;
  } while( true );
}

Assistant:

LRUHandle** FindPointer(const Slice& key, uint32_t hash) {
    LRUHandle** ptr = &list_[hash & (length_ - 1)];
    while (*ptr != nullptr && ((*ptr)->hash != hash || key != (*ptr)->key())) {
      ptr = &(*ptr)->next_hash;
    }
    return ptr;
  }